

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Rendering.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Rendering_Normal(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  _List_node_base *p_Var5;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  char *__s;
  undefined4 extraout_var_01;
  _List_node_base *p_Var10;
  string *psVar11;
  uint uVar12;
  ulong uVar13;
  CX3DImporter_NodeElement *ne;
  string an;
  string use;
  string def;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> vector;
  allocator<char> local_b9;
  CX3DImporter_NodeElement *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  list<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_50;
  X3DImporter *local_38;
  undefined4 extraout_var_00;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_50;
  local_50.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl._M_node.
  _M_size = 0;
  local_50.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_50.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  uVar8 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  if (0 < (int)uVar8) {
    uVar13 = 0;
    local_38 = this;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      iVar9 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar13);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,(char *)CONCAT44(extraout_var,iVar9),&local_b9);
      iVar9 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar9 == 0) {
        iVar9 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_00,iVar9);
        psVar11 = &local_70;
LAB_0065ae8e:
        pcVar3 = (char *)psVar11->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar3,(ulong)__s);
        this = local_38;
      }
      else {
        iVar9 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar9 == 0) {
          iVar9 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_01,iVar9);
          psVar11 = &local_90;
          goto LAB_0065ae8e;
        }
        iVar9 = std::__cxx11::string::compare((char *)&local_b0);
        if (((iVar9 != 0) && (iVar9 = std::__cxx11::string::compare((char *)&local_b0), iVar9 != 0))
           && (iVar9 = std::__cxx11::string::compare((char *)&local_b0), iVar9 != 0)) {
          iVar9 = std::__cxx11::string::compare((char *)&local_b0);
          if (iVar9 == 0) {
            XML_ReadNode_GetAttrVal_AsListVec3f(this,(int)uVar13,&local_50);
          }
          else {
            Throw_IncorrectAttr(this,&local_b0);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      uVar12 = (int)uVar13 + 1;
      uVar13 = (ulong)uVar12;
    } while (uVar8 != uVar12);
  }
  if (local_90._M_string_length == 0) {
    local_b8 = (CX3DImporter_NodeElement *)operator_new(0x68);
    pCVar4 = this->NodeElement_Cur;
    local_b8->Type = ENET_Normal;
    (local_b8->ID)._M_dataplus._M_p = (pointer)&(local_b8->ID).field_2;
    (local_b8->ID)._M_string_length = 0;
    (local_b8->ID).field_2._M_local_buf[0] = '\0';
    local_b8->Parent = pCVar4;
    (local_b8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_b8->Child;
    (local_b8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_b8->Child;
    (local_b8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_b8->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Normal_008d09b8;
    *(CX3DImporter_NodeElement **)&local_b8[1].Type = local_b8 + 1;
    local_b8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_b8 + 1);
    local_b8[1].ID._M_dataplus._M_p = (pointer)0x0;
    if (local_70._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_b8->ID);
    }
    if (local_b8 + 1 != (CX3DImporter_NodeElement *)&local_50) {
      std::__cxx11::list<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_assign_dispatch<std::_List_const_iterator<aiVector3t<float>>>
                ((list<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)(local_b8 + 1),
                 local_50.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                 _M_impl._M_node.super__List_node_base._M_next);
    }
    iVar9 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_b8;
    if ((char)iVar9 == '\0') {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Normal","");
      ParseNode_Metadata(this,pCVar4,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var10 = (_List_node_base *)operator_new(0x18);
      p_Var10[1]._M_next = (_List_node_base *)local_b8;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)local_b8;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    plVar6 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_70._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar7 = FindNodeElement(this,&local_90,ENET_Normal,&local_b8);
    if (!bVar7) {
      Throw_USE_NotFound(this,&local_90);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var10 = (_List_node_base *)operator_new(0x18);
    p_Var10[1]._M_next = (_List_node_base *)local_b8;
    std::__detail::_List_node_base::_M_hook(p_Var10);
    plVar6 = &pCVar4->Child;
  }
  psVar1 = &(plVar6->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var10 = local_50.super__List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var10 != (_List_node_base *)&local_50) {
    p_Var5 = (((_List_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)
              &p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var10,0x20);
    p_Var10 = p_Var5;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                             local_90.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Rendering_Normal()
{
std::string use, def;
std::list<aiVector3D> vector;
CX3DImporter_NodeElement* ne;

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("vector", vector, XML_ReadNode_GetAttrVal_AsListVec3f);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_Normal, ne);
	}
	else
	{
		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Normal(NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		((CX3DImporter_NodeElement_Normal*)ne)->Value = vector;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "Normal");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}